

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O2

int __thiscall jrtplib::RTPPacketBuilder::Init(RTPPacketBuilder *this,size_t max)

{
  int iVar1;
  uint8_t *puVar2;
  
  if (this->init == false) {
    if (max != 0) {
      this->maxpacksize = max;
      puVar2 = (uint8_t *)operator_new__(max,(this->super_RTPMemoryObject).mgr,9);
      this->buffer = puVar2;
      if (puVar2 == (uint8_t *)0x0) {
        iVar1 = -1;
      }
      else {
        this->packetlength = 0;
        CreateNewSSRC(this);
        this->deftsset = false;
        this->defptset = false;
        this->defmarkset = false;
        this->numcsrcs = 0;
        this->init = true;
        iVar1 = 0;
      }
      return iVar1;
    }
    iVar1 = -0x13;
  }
  else {
    iVar1 = -0xc;
  }
  return iVar1;
}

Assistant:

int RTPPacketBuilder::Init(size_t max)
{
	if (init)
		return ERR_RTP_PACKBUILD_ALREADYINIT;
	if (max <= 0)
		return ERR_RTP_PACKBUILD_INVALIDMAXPACKETSIZE;
	
	maxpacksize = max;
	buffer = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTPPACKETBUILDERBUFFER) uint8_t [max];
	if (buffer == 0)
		return ERR_RTP_OUTOFMEM;
	packetlength = 0;
	
	CreateNewSSRC();

	deftsset = false;
	defptset = false;
	defmarkset = false;
		
	numcsrcs = 0;
	
	init = true;
	return 0;
}